

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O1

void __thiscall soul::TaskThread::run(TaskThread *this)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_58;
  condition_variable *local_48;
  mutex *local_40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  
  local_40 = &this->queueLock;
  local_48 = &this->checkQueues;
  do {
    if ((this->shuttingDown).super___atomic_base<int>._M_i != 0) {
      return;
    }
    local_58._M_device = local_40;
    local_58._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    bVar4 = (this->queues).
            super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (this->queues).
            super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = !bVar4;
    if (bVar4) {
      bVar4 = false;
    }
    else {
      bVar4 = false;
      if ((this->shuttingDown).super___atomic_base<int>._M_i == 0) {
        uVar3 = 0;
        do {
          bVar1 = Queue::serviceNextTask
                            ((this->queues).
                             super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar3]);
          if (bVar1) {
            bVar4 = true;
          }
          uVar3 = uVar3 + 1;
          bVar1 = uVar3 < (ulong)((long)(this->queues).
                                        super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->queues).
                                        super__Vector_base<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          if (!bVar1) goto LAB_0027d3c2;
        } while ((this->shuttingDown).super___atomic_base<int>._M_i == 0);
      }
      if (bVar1) {
        std::unique_lock<std::mutex>::~unique_lock(&local_58);
        return;
      }
    }
LAB_0027d3c2:
    if (!bVar4) {
      lVar2 = std::chrono::_V2::steady_clock::now();
      local_38.__d.__r = (duration)(lVar2 + 500000000);
      std::condition_variable::
      __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (local_48,&local_58,&local_38);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void run()
    {
        while (! shuttingDown)
        {
            bool anyTasksDone = false;
            std::unique_lock<std::mutex> l (queueLock);

            // NB: avoid iterator because the vector can be modified during the loop
            for (size_t i = 0; i < queues.size(); ++i)
            {
                if (shuttingDown)
                    return;

                if (queues[i]->serviceNextTask())
                    anyTasksDone = true;
            }

            if (! anyTasksDone)
                checkQueues.wait_for (l, std::chrono::milliseconds (500));
        }
    }